

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvascan.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  bool local_bd;
  int local_b0;
  int j_1;
  int es;
  uint64_t ch;
  uint64_t sv;
  int j;
  int areg;
  int isalias;
  int cool;
  int eb;
  int ez;
  int ev;
  int ey;
  int ew;
  int ex;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  int local_50;
  int ls;
  int32_t i;
  int32_t b;
  int32_t a;
  int unit;
  nva_regspace rs;
  int c;
  int slow;
  int alias;
  char **argv_local;
  int argc_local;
  
  iVar4 = nva_init();
  if (iVar4 == 0) {
    bVar1 = false;
    bVar2 = false;
    memset(&a,0,0x18);
    while (rs.idx = getopt(argc,argv,"asc:i:b:t:"), rs.idx != -1) {
      switch(rs.idx) {
      case 0x61:
        bVar1 = true;
        break;
      case 0x62:
        __isoc99_sscanf(_optarg,"%d",&rs.cnum);
        if ((((rs.cnum != 1) && (rs.cnum != 2)) && (rs.cnum != 4)) && (rs.cnum != 8)) {
          fprintf(_stderr,"Invalid size.\n");
          return 1;
        }
        break;
      case 99:
        __isoc99_sscanf(_optarg,"%d",&rs);
        break;
      case 0x69:
        __isoc99_sscanf(_optarg,"%d",&rs.type);
        break;
      case 0x73:
        bVar2 = true;
        break;
      case 0x74:
        rs.card._4_4_ = nva_rstype(_optarg);
        if (rs.card._4_4_ == 0x15) {
          fprintf(_stderr,"Unknown register space.\n");
          return 1;
        }
      }
    }
    if ((int)rs.card < nva_cardsnum) {
      _a = nva_cards[(int)rs.card];
      if (rs.cnum == 0) {
        rs.cnum = nva_rsdefsz((nva_regspace *)&a);
      }
      b = nva_rsunitsz((nva_regspace *)&a);
      ls = rs.cnum / b;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&i);
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[_optind + 1],"%x",&ls);
        }
        x._4_4_ = 1;
        for (local_50 = 0; local_50 < ls; local_50 = rs.cnum / b + local_50) {
          ey = nva_rd((nva_regspace *)&a,i + local_50,&y);
          ev = 0;
          ez = 0;
          eb = 0;
          cool = 0;
          isalias = 0;
          if (ey == 0) {
            ev = nva_wr((nva_regspace *)&a,i + local_50,0xffffffffffffffff);
            ez = nva_rd((nva_regspace *)&a,i + local_50,&z);
            eb = nva_wr((nva_regspace *)&a,i + local_50,0);
            cool = nva_rd((nva_regspace *)&a,i + local_50,(uint64_t *)&ew);
            isalias = nva_wr((nva_regspace *)&a,i + local_50,y);
          }
          if ((((ey == 0) && (ez == 0)) && ((cool == 0 && ((eb == 0 && (isalias == 0)))))) &&
             ((y == 0 && ((z == 0 && (_ew == 0)))))) {
            if (x._4_4_ != 0) {
              printf("...\n");
            }
            x._4_4_ = 0;
          }
          else {
            if (ey == 0) {
              local_bd = y != z || z != _ew;
              areg = (int)local_bd;
              j = 0;
              if ((areg != 0) && (bVar1)) {
                nva_wr((nva_regspace *)&a,i + local_50,0xffffffffffffffff);
                for (sv._0_4_ = 0; (int)sv < local_50; sv._0_4_ = (int)sv + 4) {
                  iVar4 = nva_rd((nva_regspace *)&a,i + (int)sv,&ch);
                  if (iVar4 == 0) {
                    iVar4 = nva_wr((nva_regspace *)&a,i + (int)sv,0);
                    iVar6 = nva_rd((nva_regspace *)&a,i + local_50,(uint64_t *)&j_1);
                    iVar7 = nva_wr((nva_regspace *)&a,i + (int)sv,ch);
                    if ((_j_1 == _ew) && (iVar7 == 0 && (iVar6 == 0 && iVar4 == 0))) {
                      sv._4_4_ = i + (int)sv;
                      j = 1;
                      break;
                    }
                  }
                }
                nva_wr((nva_regspace *)&a,i + local_50,y);
              }
              printf("%06x:",(ulong)(uint)(i + local_50));
              nva_rsprint((nva_regspace *)&a,ey,y);
              nva_rsprint((nva_regspace *)&a,ez,z);
              nva_rsprint((nva_regspace *)&a,cool,_ew);
              if (((ev != 0) || (eb != 0)) || (isalias != 0)) {
                printf(" WERR");
              }
              if (areg != 0) {
                printf(" *");
              }
              if (j != 0) {
                printf(" ALIASES %06x");
              }
              printf("\n");
            }
            else {
              uVar5 = i + local_50;
              cVar3 = nva_rserrc(ey);
              printf("%06x: %c\n",(ulong)uVar5,(ulong)(uint)(int)cVar3);
            }
            x._4_4_ = 1;
          }
          if (bVar2) {
            for (local_b0 = 0; local_b0 < 100; local_b0 = local_b0 + 1) {
              nva_rd32((int)rs.card,0);
            }
            usleep(10000);
            for (local_b0 = 0; local_b0 < 100; local_b0 = local_b0 + 1) {
              nva_rd32((int)rs.card,0);
            }
          }
        }
        argv_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"No address specified.\n",(long)rs.cnum % (long)b & 0xffffffff);
        argv_local._4_4_ = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int alias = 0;
	int slow = 0;
	int c;
	struct nva_regspace rs = { 0 };
	while ((c = getopt (argc, argv, "asc:i:b:t:")) != -1)
		switch (c) {
			case 'a':
				alias = 1;
				break;
			case 's':
				slow = 1;
				break;
			case 'c':
				sscanf(optarg, "%d", &rs.cnum);
				break;
			case 'i':
				sscanf(optarg, "%d", &rs.idx);
				break;
			case 'b':
				sscanf(optarg, "%d", &rs.regsz);
				if (rs.regsz != 1 && rs.regsz != 2 && rs.regsz != 4 && rs.regsz != 8) {
					fprintf (stderr, "Invalid size.\n");
					return 1;
				}
				break;
			case 't':
				rs.type = nva_rstype(optarg);
				if (rs.type == NVA_REGSPACE_UNKNOWN) {
					fprintf (stderr, "Unknown register space.\n");
					return 1;
				}
				break;
		}
	if (rs.cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	rs.card = nva_cards[rs.cnum];
	if (rs.regsz == 0)
		rs.regsz = nva_rsdefsz(&rs);
	int unit = nva_rsunitsz(&rs);
	int32_t a, b = rs.regsz/unit, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	int ls = 1;
	for (i = 0; i < b; i+=rs.regsz/unit) {
		uint64_t x, y, z;
		int ex = nva_rd(&rs, a+i, &x);
		int ew = 0, ey = 0, ev = 0, ez = 0, eb = 0;
		if (!ex) {
			ew = nva_wr(&rs, a+i, -1ll);
			ey = nva_rd(&rs, a+i, &y);
			ev = nva_wr(&rs, a+i, 0);
			ez = nva_rd(&rs, a+i, &z);
			eb = nva_wr(&rs, a+i, x);
		}
		if (ex || ey || ez || ey || ev || eb || x || y || z) {
			if (ex) {
				printf ("%06x: %c\n", a+i, nva_rserrc(ex));
			} else {
				int cool = (x != y) || (y != z);
				int isalias = 0, areg;
				if (cool && alias) {
					int j;
					nva_wr(&rs, a+i, -1ll);
					for (j = 0; j < i; j+=4) {
						uint64_t sv;
						uint64_t ch;
						int es = nva_rd(&rs, a+j, &sv);
						if (!es) {
							es |= nva_wr(&rs, a+j, 0);
							es |= nva_rd(&rs, a+i, &ch);
							es |= nva_wr(&rs, a+j, sv);
							if (ch == z && !es) {
								areg = a + j;
								isalias = 1;
								break;
							}
						}
					}
					nva_wr(&rs, a+i, x);
				}
				printf ("%06x:", a+i);
				nva_rsprint(&rs, ex, x);
				nva_rsprint(&rs, ey, y);
				nva_rsprint(&rs, ez, z);
				if (ew || ev || eb)
					printf(" WERR");
				if (cool)
					printf(" *");
				if (isalias) {
					printf(" ALIASES %06x", areg);
				}
				printf("\n");
			}
			ls = 1;
		} else {
			if (ls)
				printf("...\n");
			ls = 0;
		}
		if (slow) {
			int j;
			for (j = 0; j < 100; j++)
				nva_rd32(rs.cnum, 0);
			usleep(10000);
			for (j = 0; j < 100; j++)
				nva_rd32(rs.cnum, 0);
		}
	}
	return 0;
}